

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_io_check_integrity_fn(event_base *base,int fd,evmap_io *io_info,void *arg)

{
  ushort uVar1;
  event *peVar2;
  uint uVar3;
  event *peVar4;
  evmap_io *peVar5;
  undefined8 uVar6;
  uint uVar7;
  event *peVar8;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  
  peVar2 = (io_info->events).lh_first;
  peVar4 = peVar2;
  peVar8 = peVar2;
  if (peVar2 == (event *)0x0) {
LAB_001fa52c:
    uVar9 = 0;
    uVar7 = 0;
    uVar3 = 0;
    for (; peVar2 != (event *)0x0; peVar2 = (peVar2->ev_).ev_io.ev_io_next.le_next) {
      if (((peVar2->ev_evcallback).evcb_flags & 2) == 0) {
        pcVar10 = "ev->ev_flags & EVLIST_INSERTED";
        uVar6 = 0x3c3;
        goto LAB_001fa646;
      }
      if (peVar2->ev_fd != fd) {
        pcVar10 = "ev->ev_fd == fd";
        uVar6 = 0x3c4;
        goto LAB_001fa646;
      }
      uVar1 = peVar2->ev_events;
      if ((uVar1 & 8) != 0) {
        pcVar10 = "!(ev->ev_events & EV_SIGNAL)";
        uVar6 = 0x3c5;
        goto LAB_001fa646;
      }
      if ((uVar1 & 0x86) == 0) {
        pcVar10 = "(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))";
        uVar6 = 0x3c6;
        goto LAB_001fa646;
      }
      uVar9 = uVar9 + ((uVar1 >> 1 & 1) != 0);
      uVar7 = uVar7 + ((uVar1 >> 2 & 1) != 0);
      uVar3 = uVar3 + ((uVar1 >> 7 & 1) != 0);
    }
    if (uVar9 == io_info->nread) {
      if (uVar7 == io_info->nwrite) {
        if (uVar3 == io_info->nclose) {
          return 0;
        }
        pcVar10 = "n_close == io_info->nclose";
        uVar6 = 0x3d1;
      }
      else {
        pcVar10 = "n_write == io_info->nwrite";
        uVar6 = 0x3d0;
      }
    }
    else {
      pcVar10 = "n_read == io_info->nread";
      uVar6 = 0x3cf;
    }
    goto LAB_001fa646;
  }
  do {
    peVar5 = io_info;
    if ((peVar4 == (event *)0x0) ||
       (peVar8 = (peVar8->ev_).ev_io.ev_io_next.le_next, peVar8 == (event *)0x0)) goto LAB_001fa4ec;
    if (peVar4 == peVar8) break;
    peVar8 = (peVar8->ev_).ev_io.ev_io_next.le_next;
    if (peVar8 == (event *)0x0) goto LAB_001fa4ec;
    peVar4 = (peVar4->ev_).ev_io.ev_io_next.le_next;
  } while (peVar4 != peVar8);
  pcVar10 = "elm1 != elm2";
  goto LAB_001fa516;
  while (bVar11 = peVar5 == (evmap_io *)(peVar8->ev_).ev_io.ev_io_next.le_prev,
        peVar5 = (evmap_io *)&peVar8->ev_, bVar11) {
LAB_001fa4ec:
    peVar8 = (peVar5->events).lh_first;
    if (peVar8 == (event *)0x0) goto LAB_001fa52c;
  }
  pcVar10 = "nextp == elm1->ev_.ev_io.ev_io_next.le_prev";
LAB_001fa516:
  uVar6 = 0x3c0;
LAB_001fa646:
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
             ,uVar6,pcVar10,"evmap_io_check_integrity_fn");
}

Assistant:

static int
evmap_io_check_integrity_fn(struct event_base *base, evutil_socket_t fd,
    struct evmap_io *io_info, void *arg)
{
	struct event *ev;
	int n_read = 0, n_write = 0, n_close = 0;

	/* First, make sure the list itself isn't corrupt. Otherwise,
	 * running LIST_FOREACH could be an exciting adventure. */
	EVUTIL_ASSERT_LIST_OK(&io_info->events, event, ev_io_next);

	LIST_FOREACH(ev, &io_info->events, ev_io_next) {
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_INSERTED);
		EVUTIL_ASSERT(ev->ev_fd == fd);
		EVUTIL_ASSERT(!(ev->ev_events & EV_SIGNAL));
		EVUTIL_ASSERT((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED)));
		if (ev->ev_events & EV_READ)
			++n_read;
		if (ev->ev_events & EV_WRITE)
			++n_write;
		if (ev->ev_events & EV_CLOSED)
			++n_close;
	}

	EVUTIL_ASSERT(n_read == io_info->nread);
	EVUTIL_ASSERT(n_write == io_info->nwrite);
	EVUTIL_ASSERT(n_close == io_info->nclose);

	return 0;
}